

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::AddUInt64(Bignum *this,uint64_t operand)

{
  bool bVar1;
  long lVar2;
  Bignum other;
  Bignum local_204;
  
  if (operand != 0) {
    lVar2 = 0;
    do {
      local_204.bigits_buffer_[lVar2] = (uint)operand & 0xfffffff;
      lVar2 = lVar2 + 1;
      bVar1 = 0xfffffff < operand;
      operand = operand >> 0x1c;
    } while (bVar1);
    local_204.exponent_ = 0;
    local_204.used_bigits_ = (ushort)lVar2;
    AddBignum(this,&local_204);
  }
  return;
}

Assistant:

void Bignum::AddUInt64(const uint64_t operand) {
  if (operand == 0) {
    return;
  }
  Bignum other;
  other.AssignUInt64(operand);
  AddBignum(other);
}